

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool getTypedProperty<bool>
               (cmGeneratorTarget *tgt,string *prop,
               cmGeneratorExpressionInterpreter *genexInterpreter)

{
  bool bVar1;
  cmValue cVar2;
  string *psVar3;
  char *extraout_RDX;
  string_view value;
  allocator<char> local_41;
  string local_40;
  
  if (genexInterpreter != (cmGeneratorExpressionInterpreter *)0x0) {
    cVar2 = cmGeneratorTarget::GetProperty(tgt,prop);
    if (cVar2.Value == (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
    }
    else {
      std::__cxx11::string::string((string *)&local_40,(string *)cVar2.Value);
    }
    psVar3 = cmGeneratorExpressionInterpreter::Evaluate(genexInterpreter,&local_40,prop);
    value._M_str = extraout_RDX;
    value._M_len = (size_t)(psVar3->_M_dataplus)._M_p;
    bVar1 = cmValue::IsOn((cmValue *)psVar3->_M_string_length,value);
    std::__cxx11::string::~string((string *)&local_40);
    return bVar1;
  }
  bVar1 = cmGeneratorTarget::GetPropertyAsBool(tgt,prop);
  return bVar1;
}

Assistant:

bool getTypedProperty<bool>(cmGeneratorTarget const* tgt,
                            const std::string& prop,
                            cmGeneratorExpressionInterpreter* genexInterpreter)
{
  if (genexInterpreter == nullptr) {
    return tgt->GetPropertyAsBool(prop);
  }

  cmValue value = tgt->GetProperty(prop);
  return cmIsOn(genexInterpreter->Evaluate(value ? *value : "", prop));
}